

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

char __thiscall YAML::Stream::get(Stream *this)

{
  char cVar1;
  Stream *in_RDI;
  char ch;
  undefined7 in_stack_fffffffffffffff0;
  
  cVar1 = peek(in_RDI);
  AdvanceCurrent((Stream *)CONCAT17(cVar1,in_stack_fffffffffffffff0));
  (in_RDI->m_mark).column = (in_RDI->m_mark).column + 1;
  if (cVar1 == '\n') {
    (in_RDI->m_mark).column = 0;
    (in_RDI->m_mark).line = (in_RDI->m_mark).line + 1;
  }
  return cVar1;
}

Assistant:

char Stream::get() {
  char ch = peek();
  AdvanceCurrent();
  m_mark.column++;

  if (ch == '\n') {
    m_mark.column = 0;
    m_mark.line++;
  }

  return ch;
}